

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

char * sh4asm_tok_as_str(sh4asm_tok *tk)

{
  sh4asm_tok_mapping *psVar1;
  tok_tp tVar2;
  tok_tp tVar3;
  tok_tp *ptVar4;
  char *__format;
  
  tVar2 = tk->tp;
  switch(tVar2) {
  case SH4ASM_TOK_RN:
    __format = "r%u";
    break;
  case SH4ASM_TOK_RN_BANK:
    __format = "r%u_bank";
    break;
  case SH4ASM_TOK_FRN:
    __format = "fr%u";
    break;
  case SH4ASM_TOK_DRN:
    __format = "dr%u";
    break;
  case SH4ASM_TOK_XDN:
    __format = "xd%u";
    break;
  case SH4ASM_TOK_FVN:
    __format = "fv%u";
    break;
  case SH4ASM_TOK_IMM:
    __format = "#0x%x";
    break;
  case SH4ASM_TOK_DISP:
    __format = "0x%x";
    break;
  default:
    if (tVar2 == SH4ASM_TOK_COMMA) {
      return ",";
    }
  case SH4ASM_TOK_XMTRX:
    ptVar4 = &tok_map[1].tok;
    do {
      psVar1 = (sh4asm_tok_mapping *)(ptVar4 + -2);
      if (psVar1->txt == (char *)0x0) {
        return (char *)0x0;
      }
      tVar3 = *ptVar4;
      ptVar4 = ptVar4 + 4;
    } while (tVar3 != tVar2);
    return psVar1->txt;
  }
  snprintf(sh4asm_tok_as_str::buf,0x20,__format,(ulong)(uint)(tk->val).as_int);
  sh4asm_tok_as_str::buf[0x1f] = '\0';
  return sh4asm_tok_as_str::buf;
}

Assistant:

char const *sh4asm_tok_as_str(struct sh4asm_tok const *tk) {
    static char buf[SH4ASM_TOK_LEN_MAX];

    if (tk->tp == SH4ASM_TOK_IMM) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "#0x%x", tk->val.as_int);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_RN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "r%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_RN_BANK) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "r%u_bank", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_FRN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "fr%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_DRN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "dr%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_XDN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "xd%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_FVN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "fv%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_DISP) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "0x%x", tk->val.as_int);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    }

    struct sh4asm_tok_mapping const *curs = tok_map;
    while (curs->txt) {
        if (curs->tok == tk->tp)
            return curs->txt;
        curs++;
    }

    return NULL;
}